

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

int64_t __thiscall leveldb::VersionSet::NumLevelBytes(VersionSet *this,int level)

{
  int64_t iVar1;
  int in_ESI;
  long in_FS_OFFSET;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  
  files = *(vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> **)
           (in_FS_OFFSET + 0x28);
  if (in_ESI < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x485,"int64_t leveldb::VersionSet::NumLevelBytes(int) const");
  }
  if (in_ESI < 7) {
    iVar1 = TotalFileSize(files);
    if (*(vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> **)
         (in_FS_OFFSET + 0x28) == files) {
      return iVar1;
    }
    __stack_chk_fail();
  }
  __assert_fail("level < config::kNumLevels",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                ,0x486,"int64_t leveldb::VersionSet::NumLevelBytes(int) const");
}

Assistant:

int64_t VersionSet::NumLevelBytes(int level) const {
  assert(level >= 0);
  assert(level < config::kNumLevels);
  return TotalFileSize(current_->files_[level]);
}